

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_cbc_hmac_sha1_hw.c
# Opt level: O0

void aesni_cbc_hmac_sha1_set_mac_key(void *vctx,uchar *mac,size_t len)

{
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  uchar hmac_key [64];
  uint i;
  PROV_AES_HMAC_SHA1_CTX *ctx;
  byte abStackY_68 [8];
  size_t in_stack_ffffffffffffffa0;
  void *in_stack_ffffffffffffffa8;
  SHA_CTX *in_stack_ffffffffffffffb0;
  uint local_24;
  
  memset(abStackY_68,0,0x40);
  if (in_RDX < 0x41) {
    memcpy(abStackY_68,in_RSI,in_RDX);
  }
  else {
    SHA1_Init((SHA_CTX *)(in_RDI + 0x1f8));
    sha1_update(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    SHA1_Final(abStackY_68,(SHA_CTX *)(in_RDI + 0x1f8));
  }
  for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 1) {
    abStackY_68[local_24] = abStackY_68[local_24] ^ 0x36;
  }
  SHA1_Init((SHA_CTX *)(in_RDI + 0x1f8));
  sha1_update(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  for (local_24 = 0; local_24 < 0x40; local_24 = local_24 + 1) {
    abStackY_68[local_24] = abStackY_68[local_24] ^ 0x6a;
  }
  SHA1_Init((SHA_CTX *)(in_RDI + 600));
  sha1_update(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  OPENSSL_cleanse(abStackY_68,0x40);
  return;
}

Assistant:

static void aesni_cbc_hmac_sha1_set_mac_key(void *vctx,
                                            const unsigned char *mac, size_t len)
{
    PROV_AES_HMAC_SHA1_CTX *ctx = (PROV_AES_HMAC_SHA1_CTX *)vctx;
    unsigned int i;
    unsigned char hmac_key[64];

    memset(hmac_key, 0, sizeof(hmac_key));

    if (len > (int)sizeof(hmac_key)) {
        SHA1_Init(&ctx->head);
        sha1_update(&ctx->head, mac, len);
        SHA1_Final(hmac_key, &ctx->head);
    } else {
        memcpy(hmac_key, mac, len);
    }

    for (i = 0; i < sizeof(hmac_key); i++)
        hmac_key[i] ^= 0x36; /* ipad */
    SHA1_Init(&ctx->head);
    sha1_update(&ctx->head, hmac_key, sizeof(hmac_key));

    for (i = 0; i < sizeof(hmac_key); i++)
        hmac_key[i] ^= 0x36 ^ 0x5c; /* opad */
    SHA1_Init(&ctx->tail);
    sha1_update(&ctx->tail, hmac_key, sizeof(hmac_key));

    OPENSSL_cleanse(hmac_key, sizeof(hmac_key));
}